

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

void __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::ParallelFunctionAnalysis
          (ParallelFunctionAnalysis<std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
           *this,Module *wasm,Func *work)

{
  Map *this_00;
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  Function *pFVar3;
  Module *module;
  mapped_type *pmVar4;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar5;
  PassRunner local_2a8;
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> local_190;
  undefined1 local_78 [16];
  code *local_68;
  _Any_data local_58;
  code *local_48;
  Module *local_38;
  
  this->wasm = wasm;
  this_00 = &this->map;
  p_Var1 = &(this->map)._M_t._M_impl.super__Rb_tree_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar5 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = wasm;
  if (puVar5 != puVar2) {
    do {
      local_190.super_Pass._vptr_Pass =
           (_func_int **)
           (puVar5->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      std::
      map<wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_>_>_>
      ::operator[]((map<wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_>_>_>
                    *)this_00,(key_type *)&local_190);
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar2);
    puVar2 = (local_38->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar5 = (local_38->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1)
    {
      pFVar3 = (puVar5->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar3->super_Importable).module + 8) != (char *)0x0) {
        local_2a8._vptr_PassRunner = (_func_int **)pFVar3;
        pmVar4 = std::
                 map<wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_>_>_>
                 ::operator[]((map<wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_>_>_>
                               *)this_00,(key_type *)&local_2a8);
        local_190.super_Pass._vptr_Pass = (_func_int **)pFVar3;
        if ((work->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*work->_M_invoker)((_Any_data *)work,(Function **)&local_190,
                            (unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                             *)pmVar4);
      }
    }
  }
  module = local_38;
  local_2a8.options.arguments._M_h._M_buckets = &local_2a8.options.arguments._M_h._M_single_bucket;
  local_2a8._vptr_PassRunner = (_func_int **)&PTR__PassRunner_00d727e0;
  local_2a8.wasm = local_38;
  local_2a8.allocator = &local_38->allocator;
  local_2a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_2a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_2a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_2a8._41_8_ = 0;
  local_2a8.options.validate = true;
  local_2a8.options.validateGlobally = true;
  local_2a8.options.optimizeLevel = 0;
  local_2a8.options.shrinkLevel = 0;
  local_2a8.options.inlining.alwaysInlineMaxSize = 2;
  local_2a8.options.inlining.oneCallerInlineMaxSize = 0xffffffff;
  local_2a8.options.inlining.flexibleInlineMaxSize = 0x14;
  local_2a8.options.inlining.allowFunctionsWithLoops = false;
  local_2a8.options.zeroFilledMemory = false;
  local_2a8.options.closedWorld = false;
  local_2a8.options.debugInfo = false;
  local_2a8.options.targetJS = false;
  local_2a8.options.inlining.partialInliningIfs = 0;
  local_2a8.options.ignoreImplicitTraps = false;
  local_2a8.options.trapsNeverHappen = false;
  local_2a8.options.lowMemoryUnused = false;
  local_2a8.options.fastMath = false;
  local_2a8.options.arguments._M_h._M_bucket_count = 1;
  local_2a8.options.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2a8.options.arguments._M_h._M_element_count = 0;
  local_2a8.options.arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2a8.options.arguments._M_h._M_rehash_policy._M_next_resize = 0;
  local_2a8.options.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2a8.options.passesToSkip._M_h._M_buckets =
       &local_2a8.options.passesToSkip._M_h._M_single_bucket;
  local_2a8.options.passesToSkip._M_h._M_bucket_count = 1;
  local_2a8.options.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2a8.options.passesToSkip._M_h._M_element_count = 0;
  local_2a8.options.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2a8.skippedPasses._M_h._M_buckets = &local_2a8.skippedPasses._M_h._M_single_bucket;
  local_2a8.options.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_2a8.options.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_7_ = 0;
  local_2a8._215_4_ = 0;
  local_2a8.options.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
  local_2a8.options.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2a8.skippedPasses._M_h._M_bucket_count = 1;
  local_2a8.skippedPasses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2a8.skippedPasses._M_h._M_element_count = 0;
  local_2a8.skippedPasses._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2a8.skippedPasses._M_h._M_rehash_policy._M_next_resize = 0;
  local_2a8.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  function<void_(wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_&)>
  ::function((function<void_(wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_&)>
              *)&local_58,
             (function<void_(wasm::Function_*,_std::unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>_&)>
              *)work);
  ParallelFunctionAnalysis<std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::
  allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::
  pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>,(wasm::
  Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::
  function<void(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::
  allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::
  pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)>)::
  Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,std::unordered_map<wasm::Name,std::
  vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::
  equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::
  allocator<wasm::Expression*>>>>>,std::less<wasm::Function*>,std::allocator<std::pair<wasm::
  Function*const,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::
  Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::
  Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>>>>&,std::
  function<void(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::
  allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::
  pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression_>_>_>_>_>__>_
            (&local_190,module,this_00,(Func *)&local_58);
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::run
            (&local_190,&local_2a8,module);
  local_190.super_Pass._vptr_Pass = (_func_int **)&PTR__Mapper_00d74738;
  if (local_68 != (code *)0x0) {
    (*local_68)(local_78,local_78,3);
  }
  if (local_190.super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
      super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task,_std::allocator<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                    super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task,_std::allocator<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_190.super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                          super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.flexible.
                          super__Vector_base<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task,_std::allocator<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                          super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.flexible.
                          super__Vector_base<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task,_std::allocator<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_190.super_Pass._vptr_Pass = (_func_int **)&PTR__Pass_00d722d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.super_Pass.name._M_dataplus._M_p != &local_190.super_Pass.name.field_2) {
    operator_delete(local_190.super_Pass.name._M_dataplus._M_p,
                    local_190.super_Pass.name.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  PassRunner::~PassRunner(&local_2a8);
  return;
}

Assistant:

ParallelFunctionAnalysis(Module& wasm, Func work) : wasm(wasm) {
    // Fill in map, as we operate on it in parallel (each function to its own
    // entry).
    for (auto& func : wasm.functions) {
      map[func.get()];
    }

    // Run on the imports first. TODO: parallelize this too
    for (auto& func : wasm.functions) {
      if (func->imported()) {
        work(func.get(), map[func.get()]);
      }
    }

    struct Mapper : public WalkerPass<PostWalker<Mapper>> {
      bool isFunctionParallel() override { return true; }
      bool modifiesBinaryenIR() override { return Mut; }

      Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<Mapper>(module, map, work);
      }

      void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }

    private:
      Module& module;
      Map& map;
      Func work;
    };

    PassRunner runner(&wasm);
    Mapper(wasm, map, work).run(&runner, &wasm);
  }